

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauden.c
# Opt level: O2

void gauden_accum_param_full
               (vector_t ****out,vector_t ****in,uint32 n_mgau,uint32 n_feat,uint32 n_density,
               uint32 *veclen)

{
  uint uVar1;
  vector_t pfVar2;
  vector_t pfVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  
  for (uVar4 = 0; uVar4 != n_mgau; uVar4 = uVar4 + 1) {
    for (uVar5 = 0; uVar5 != n_feat; uVar5 = uVar5 + 1) {
      for (uVar6 = 0; uVar6 != n_density; uVar6 = uVar6 + 1) {
        uVar1 = veclen[uVar5];
        for (uVar8 = 0; uVar8 != uVar1; uVar8 = uVar8 + 1) {
          pfVar2 = in[uVar4][uVar5][uVar6][uVar8];
          pfVar3 = out[uVar4][uVar5][uVar6][uVar8];
          for (uVar7 = 0; uVar1 != uVar7; uVar7 = uVar7 + 1) {
            pfVar3[uVar7] = pfVar2[uVar7] + pfVar3[uVar7];
          }
        }
      }
    }
  }
  return;
}

Assistant:

void
gauden_accum_param_full(vector_t ****out,
			vector_t ****in,
			uint32 n_mgau,
			uint32 n_feat,
			uint32 n_density,
			const uint32 *veclen)
{
    uint32 i, j, k, l, ll;

    for (i = 0; i < n_mgau; i++) {
	for (j = 0; j < n_feat; j++) {
	    for (k = 0; k < n_density; k++) {
		for (l = 0; l < veclen[j]; l++) {
		    for (ll = 0; ll < veclen[j]; ll++) {
			out[i][j][k][l][ll] += in[i][j][k][l][ll];
		    }
		}
	    }
	}
    }
}